

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  byte bVar1;
  char *in_RSI;
  string *in_stack_00000088;
  UnitTestFilter *in_stack_00000090;
  undefined7 in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff78;
  UnitTestFilter *in_stack_ffffffffffffff80;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,in_RSI,(allocator *)&stack0xffffffffffffff7f);
  anon_unknown_35::UnitTestFilter::UnitTestFilter(in_stack_00000090,in_stack_00000088);
  bVar1 = anon_unknown_35::UnitTestFilter::MatchesName
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  anon_unknown_35::UnitTestFilter::~UnitTestFilter
            ((UnitTestFilter *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return (bool)(bVar1 & 1);
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}